

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O0

int pathSegment(void *userData,char *pathSegment,size_t pathSegmentLen)

{
  size_t sVar1;
  bool bVar2;
  uint uVar3;
  IResultCapture *pIVar4;
  ExpressionResultBuilder *pEVar5;
  undefined8 uVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  allocator local_6d1;
  value_type local_6d0;
  undefined1 local_6a9;
  undefined1 local_6a8 [7];
  bool this_is_here_to_invoke_warnings_1;
  uint local_480;
  allocator<char> local_479;
  Value internal_catch_action_1;
  allocator<char> local_451;
  string local_450;
  SourceLineInfo local_430;
  allocator<char> local_401;
  string local_400;
  undefined1 local_3e0 [8];
  AssertionInfo __assertionInfo171;
  undefined1 local_368 [7];
  bool this_is_here_to_invoke_warnings;
  uint local_140;
  allocator<char> local_139;
  Value internal_catch_action;
  allocator<char> local_111;
  string local_110;
  SourceLineInfo local_f0;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [8];
  AssertionInfo __assertionInfo170;
  size_t pathSegmentLen_local;
  char *pathSegment_local;
  void *userData_local;
  
  __assertionInfo170._104_8_ = pathSegmentLen;
  pathSegmentLen_local = (size_t)pathSegment;
  pathSegment_local = (char *)userData;
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"CAPTURE",&local_b1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_110,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
               ,&local_111);
    Catch::SourceLineInfo::SourceLineInfo(&local_f0,&local_110,0xaa);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&internal_catch_action,"",&local_139);
    Catch::AssertionInfo::AssertionInfo
              ((AssertionInfo *)local_90,&local_b0,&local_f0,(string *)&internal_catch_action,
               ContinueOnFailure);
    std::__cxx11::string::~string((string *)&internal_catch_action);
    std::allocator<char>::~allocator(&local_139);
    Catch::SourceLineInfo::~SourceLineInfo(&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::allocator<char>::~allocator(&local_111);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    pIVar4 = Catch::getResultCapture();
    Catch::ExpressionResultBuilder::ExpressionResultBuilder
              ((ExpressionResultBuilder *)local_368,Info);
    pEVar5 = Catch::ExpressionResultBuilder::operator<<
                       ((ExpressionResultBuilder *)local_368,(char (*) [16])"pathSegment := ");
    pEVar5 = Catch::ExpressionResultBuilder::operator<<(pEVar5,(char **)&pathSegmentLen_local);
    uVar3 = (*pIVar4->_vptr_IResultCapture[8])(pIVar4,pEVar5,local_90);
    Catch::ExpressionResultBuilder::~ExpressionResultBuilder((ExpressionResultBuilder *)local_368);
    local_140 = uVar3;
    if (uVar3 != 0) {
      if ((uVar3 & 2) != 0) {
        BreakIntoDebugger();
      }
      if ((local_140 & 4) != 0) {
        uVar6 = __cxa_allocate_exception(1);
        __cxa_throw(uVar6,&Catch::TestFailureException::typeinfo,0);
      }
      bVar2 = Catch::shouldContinueOnFailure(1);
      if (!bVar2) {
        uVar6 = __cxa_allocate_exception(1);
        __cxa_throw(uVar6,&Catch::TestFailureException::typeinfo,0);
      }
      bVar2 = Catch::isTrue(false);
      if (bVar2) {
        __assertionInfo171._111_1_ = 1;
        Catch::isTrue(true);
      }
    }
    Catch::AssertionInfo::~AssertionInfo((AssertionInfo *)local_90);
    bVar2 = Catch::isTrue(false);
  } while (bVar2);
  do {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_400,"CAPTURE",&local_401);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_450,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/cloderic[P]curi/tests/Common.h"
               ,&local_451);
    Catch::SourceLineInfo::SourceLineInfo(&local_430,&local_450,0xab);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&internal_catch_action_1,"",&local_479);
    Catch::AssertionInfo::AssertionInfo
              ((AssertionInfo *)local_3e0,&local_400,&local_430,(string *)&internal_catch_action_1,
               ContinueOnFailure);
    std::__cxx11::string::~string((string *)&internal_catch_action_1);
    std::allocator<char>::~allocator(&local_479);
    Catch::SourceLineInfo::~SourceLineInfo(&local_430);
    std::__cxx11::string::~string((string *)&local_450);
    std::allocator<char>::~allocator(&local_451);
    std::__cxx11::string::~string((string *)&local_400);
    std::allocator<char>::~allocator(&local_401);
    pIVar4 = Catch::getResultCapture();
    Catch::ExpressionResultBuilder::ExpressionResultBuilder
              ((ExpressionResultBuilder *)local_6a8,Info);
    pEVar5 = Catch::ExpressionResultBuilder::operator<<
                       ((ExpressionResultBuilder *)local_6a8,(char (*) [19])"pathSegmentLen := ");
    pEVar5 = Catch::ExpressionResultBuilder::operator<<
                       (pEVar5,(unsigned_long *)&__assertionInfo170.resultDisposition);
    uVar3 = (*pIVar4->_vptr_IResultCapture[8])(pIVar4,pEVar5,local_3e0);
    Catch::ExpressionResultBuilder::~ExpressionResultBuilder((ExpressionResultBuilder *)local_6a8);
    local_480 = uVar3;
    if (uVar3 != 0) {
      if ((uVar3 & 2) != 0) {
        BreakIntoDebugger();
      }
      if ((local_480 & 4) != 0) {
        uVar6 = __cxa_allocate_exception(1);
        __cxa_throw(uVar6,&Catch::TestFailureException::typeinfo,0);
      }
      bVar2 = Catch::shouldContinueOnFailure(1);
      if (!bVar2) {
        uVar6 = __cxa_allocate_exception(1);
        __cxa_throw(uVar6,&Catch::TestFailureException::typeinfo,0);
      }
      bVar2 = Catch::isTrue(false);
      if (bVar2) {
        local_6a9 = 1;
        Catch::isTrue(true);
      }
    }
    Catch::AssertionInfo::~AssertionInfo((AssertionInfo *)local_3e0);
    bVar2 = Catch::isTrue(false);
    sVar1 = pathSegmentLen_local;
    uVar6 = __assertionInfo170._104_8_;
    if (!bVar2) {
      this = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(pathSegment_local + 0xb8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_6d0,(char *)sVar1,uVar6,&local_6d1);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::push_back(this,&local_6d0);
      std::__cxx11::string::~string((string *)&local_6d0);
      std::allocator<char>::~allocator((allocator<char> *)&local_6d1);
      return 1;
    }
  } while( true );
}

Assistant:

inline int pathSegment(void* userData, const char* pathSegment, size_t pathSegmentLen)
{
    CAPTURE(pathSegment);
    CAPTURE(pathSegmentLen);
    static_cast<URI*>(userData)->pathSegments.push_back(std::string(pathSegment,pathSegmentLen));
    return 1;
}